

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O2

int testUTF8(int param_1,char **param_2)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  test_utf8_entry *e;
  test_utf8_entry *ptVar4;
  test_utf8_char *first;
  int iVar5;
  uint uVar6;
  uint uc;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ptVar4 = good_entry;
  pcVar3 = (char *)((long)&local_48 + 4);
  iVar5 = 0;
  do {
    if (ptVar4->n == 0) {
      for (first = bad_chars; (*first)[0] != '\0'; first = first + 1) {
        local_48 = CONCAT44(local_48._4_4_,0xffff);
        pcVar3 = cm_utf8_decode_character(*first,*first + 4,(uint *)&local_48);
        if (pcVar3 == (char *)0x0) {
          report_bad(true,*first);
          puts("failed as expected");
        }
        else {
          report_bad(false,*first);
          printf("expected failure, got 0x%04X\n",local_48 & 0xffffffff);
          iVar5 = 1;
        }
      }
      return iVar5;
    }
    local_48._0_4_ = ptVar4->n;
    local_48._4_1_ = ptVar4->str[0];
    local_48._5_1_ = ptVar4->str[1];
    local_48._6_1_ = ptVar4->str[2];
    local_48._7_1_ = ptVar4->str[3];
    uStack_40 = *(undefined8 *)(ptVar4->str + 4);
    pcVar2 = cm_utf8_decode_character(pcVar3,(char *)&uStack_40,&uc);
    if (pcVar2 == (char *)0x0) {
      report_good(false,pcVar3);
      puts("failed");
LAB_00130cc3:
      iVar5 = 1;
    }
    else {
      if (uc != uStack_40._4_4_) {
        report_good(false,pcVar3);
        pcVar2 = "expected 0x%04X, got 0x%04X\n";
        uVar6 = uc;
        uVar1 = uStack_40._4_4_;
LAB_00130cbc:
        printf(pcVar2,(ulong)uVar1,(ulong)uVar6);
        goto LAB_00130cc3;
      }
      uVar6 = (int)pcVar2 - (int)pcVar3;
      if ((uint)local_48 != uVar6) {
        report_good(false,pcVar3);
        pcVar2 = "had %d bytes, used %d\n";
        uVar1 = (uint)local_48;
        goto LAB_00130cbc;
      }
      report_good(true,pcVar3);
      printf("got 0x%04X\n",(ulong)uc);
    }
    ptVar4 = ptVar4 + 1;
  } while( true );
}

Assistant:

int testUTF8(int, char*[])
{
  int result = 0;
  for(test_utf8_entry const* e = good_entry; e->n; ++e)
    {
    if(!decode_good(*e))
      {
      result = 1;
      }
    }
  for(test_utf8_char const* c = bad_chars; (*c)[0]; ++c)
    {
    if(!decode_bad(*c))
      {
      result = 1;
      }
    }
  return result;
}